

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

int split_init(saucy *s,coloring *c,int cf,int ff)

{
  int ff_local;
  int cf_local;
  coloring *c_local;
  saucy *s_local;
  
  split_left(s,c,cf,ff);
  if (c->clen[ff] != 0) {
    s->prevnon[s->nextnon[cf]] = ff;
    s->nextnon[ff] = s->nextnon[cf];
    s->prevnon[ff] = cf;
    s->nextnon[cf] = ff;
  }
  if (c->clen[cf] == 0) {
    s->nextnon[s->prevnon[cf]] = s->nextnon[cf];
    s->prevnon[s->nextnon[cf]] = s->prevnon[cf];
  }
  return 1;
}

Assistant:

static int
split_init(struct saucy *s, struct coloring *c, int cf, int ff)
{
    split_left(s, c, cf, ff);

    /* Maintain nonsingleton list for finding new targets */
    if (c->clen[ff]) {
        s->prevnon[s->nextnon[cf]] = ff;
        s->nextnon[ff] = s->nextnon[cf];
        s->prevnon[ff] = cf;
        s->nextnon[cf] = ff;
    }
    if (!c->clen[cf]) {
        s->nextnon[s->prevnon[cf]] = s->nextnon[cf];
        s->prevnon[s->nextnon[cf]] = s->prevnon[cf];
    }

    /* Always succeeds */
    return 1;
}